

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

arg_rex * arg_rexn(char *shortopts,char *longopts,char *pattern,char *datatype,int mincount,
                  int maxcount,int flags,char *glossary)

{
  arg_rex *paVar1;
  arg_rex *paVar2;
  ulong uVar3;
  TRex *exp;
  char *pcVar4;
  ulong uVar5;
  char *local_40;
  char *local_38;
  
  local_40 = (char *)0x0;
  if (pattern == (char *)0x0) {
    puts("argtable: ERROR - illegal regular expression pattern \"(NULL)\"");
    puts("argtable: Bad argument table.");
  }
  else {
    if (maxcount <= mincount) {
      maxcount = mincount;
    }
    local_38 = longopts;
    paVar2 = (arg_rex *)malloc((long)maxcount * 8 + 0x80);
    uVar3 = 0;
    if (paVar2 != (arg_rex *)0x0) {
      (paVar2->hdr).flag = '\x02';
      (paVar2->hdr).shortopts = shortopts;
      if (datatype == (char *)0x0) {
        datatype = pattern;
      }
      (paVar2->hdr).longopts = local_38;
      (paVar2->hdr).datatype = datatype;
      (paVar2->hdr).glossary = glossary;
      (paVar2->hdr).mincount = mincount;
      (paVar2->hdr).maxcount = maxcount;
      (paVar2->hdr).parent = paVar2;
      (paVar2->hdr).resetfn = arg_rex_resetfn;
      (paVar2->hdr).scanfn = arg_rex_scanfn;
      (paVar2->hdr).checkfn = arg_rex_checkfn;
      (paVar2->hdr).errorfn = arg_rex_errorfn;
      paVar1 = paVar2 + 1;
      (paVar2->hdr).priv = paVar1;
      *(char **)&paVar2[1].hdr = pattern;
      *(int *)&paVar2[1].hdr.shortopts = flags;
      paVar2->sval = &paVar2[1].hdr.longopts;
      paVar2->count = 0;
      uVar5 = (ulong)(uint)maxcount;
      if (maxcount < 1) {
        uVar5 = uVar3;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        paVar2->sval[uVar3] = "";
      }
      exp = trex_compile(*(char **)&paVar1->hdr,&local_40,flags);
      if (exp == (TRex *)0x0) {
        pcVar4 = "undefined";
        if (local_40 != (char *)0x0) {
          pcVar4 = local_40;
        }
        dbg_printf("argtable: %s \"%s\"\n",pcVar4,*(undefined8 *)&paVar1->hdr);
        dbg_printf("argtable: Bad argument table.\n");
      }
      trex_free(exp);
      return paVar2;
    }
  }
  return (arg_rex *)0x0;
}

Assistant:

struct arg_rex * arg_rexn(const char * shortopts,
						  const char * longopts,
						  const char * pattern,
						  const char * datatype,
						  int mincount,
						  int maxcount,
						  int flags,
						  const char * glossary) {
	size_t nbytes;
	struct arg_rex * result;
	struct privhdr * priv;
	int i;
	const TRexChar * error = NULL;
	TRex * rex = NULL;

	if (!pattern) {
		printf(
			"argtable: ERROR - illegal regular expression pattern \"(NULL)\"\n");
		printf("argtable: Bad argument table.\n");
		return NULL;
	}

	/* foolproof things by ensuring maxcount is not less than mincount */
	maxcount = (maxcount < mincount) ? mincount : maxcount;

	nbytes = sizeof(struct arg_rex)       /* storage for struct arg_rex */
			 + sizeof(struct privhdr)     /* storage for private arg_rex data */
			 + maxcount * sizeof(char *);  /* storage for sval[maxcount] array */

	result = (struct arg_rex *)malloc(nbytes);

	if (result == NULL) {
		return result;
	}

	/* init the arg_hdr struct */
	result->hdr.flag      = ARG_HASVALUE;
	result->hdr.shortopts = shortopts;
	result->hdr.longopts  = longopts;
	result->hdr.datatype  = datatype ? datatype : pattern;
	result->hdr.glossary  = glossary;
	result->hdr.mincount  = mincount;
	result->hdr.maxcount  = maxcount;
	result->hdr.parent    = result;
	result->hdr.resetfn   = (arg_resetfn *)arg_rex_resetfn;
	result->hdr.scanfn    = (arg_scanfn *)arg_rex_scanfn;
	result->hdr.checkfn   = (arg_checkfn *)arg_rex_checkfn;
	result->hdr.errorfn   = (arg_errorfn *)arg_rex_errorfn;

	/* store the arg_rex_priv struct immediately after the arg_rex struct */
	result->hdr.priv  = result + 1;
	priv = (struct privhdr *)(result->hdr.priv);
	priv->pattern = pattern;
	priv->flags = flags;

	/* store the sval[maxcount] array immediately after the arg_rex_priv struct */
	result->sval  = (const char * *)(priv + 1);
	result->count = 0;

	/* foolproof the string pointers by initializing them to reference empty strings */
	for (i = 0; i < maxcount; i++) {
		result->sval[i] = "";
	}

	/* here we construct and destroy a regex representation of the regular
	 * expression for no other reason than to force any regex errors to be
	 * trapped now rather than later. If we don't, then errors may go undetected
	 * until an argument is actually parsed.
	 */

	rex = trex_compile(priv->pattern, &error, priv->flags);

	if (rex == NULL) {
		ARG_LOG(("argtable: %s \"%s\"\n", error ? error : _TREXC("undefined"), priv->pattern));
		ARG_LOG(("argtable: Bad argument table.\n"));
	}

	trex_free(rex);

	ARG_TRACE(("arg_rexn() returns %p\n", result));
	return result;
}